

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::handleLvalue
          (HlslParseContext *this,TSourceLoc *loc,char *op,TIntermTyped **node)

{
  uint uVar1;
  TIntermediate *pTVar2;
  longlong lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  HlslParseContext *pHVar8;
  TIntermNode *node_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar9;
  long lVar10;
  TIntermTyped *pTVar11;
  undefined4 extraout_var_06;
  TSampler *sampler;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TIntermAggregate *pTVar12;
  undefined4 extraout_var_14;
  TIntermUnary *pTVar13;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  long lVar14;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  TIntermSymbol *left;
  undefined4 extraout_var_26;
  TIntermBinary *pTVar15;
  TPoolAllocator *pTVar16;
  TIntermAggregate *pTVar17;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  TIntermSymbol *pTVar18;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  TIntermSymbol *pTVar19;
  _func_int **pp_Var20;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  undefined1 *puVar24;
  TSourceLoc *loc_00;
  HlslParseContext *pHVar25;
  long lVar26;
  TIntermAggregate *sequence;
  anon_class_24_3_d1780b14 makeStore;
  TType objDerefType;
  TIntermAggregate *local_130;
  undefined8 local_128;
  TIntermSymbol *local_120;
  HlslParseContext *local_118;
  TIntermTyped *local_110;
  TSourceLoc *local_108;
  TIntermSymbol *local_100;
  TIntermTyped *local_f8;
  TIntermSymbol *local_f0;
  TIntermSymbol *local_e8;
  anon_class_24_3_d1780b14 local_e0;
  TType local_c8;
  HlslParseContext *pHVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (*node == (TIntermTyped *)0x0) {
LAB_0037b7d2:
    pTVar11 = (TIntermTyped *)0x0;
  }
  else {
    iVar5 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[8])();
    pHVar7 = (HlslParseContext *)CONCAT44(extraout_var,iVar5);
    pHVar25 = (HlslParseContext *)*node;
    iVar5 = (*(pHVar25->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[7])();
    pHVar8 = (HlslParseContext *)CONCAT44(extraout_var_00,iVar5);
    local_130 = (TIntermAggregate *)0x0;
    local_110 = (TIntermTyped *)op;
    if (pHVar8 == (HlslParseContext *)0x0) {
      if (pHVar7 != (HlslParseContext *)0x0) {
        pHVar25 = pHVar7;
        iVar5 = (*(pHVar7->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x32])
                          ();
        node_00 = (TIntermNode *)CONCAT44(extraout_var_02,iVar5);
        goto LAB_0037b3cd;
      }
      shouldConvertLValue(pHVar25,(TIntermNode *)0x0);
    }
    else {
      pHVar25 = pHVar8;
      iVar5 = (*(pHVar8->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x31])()
      ;
      node_00 = (TIntermNode *)CONCAT44(extraout_var_01,iVar5);
LAB_0037b3cd:
      bVar4 = shouldConvertLValue(pHVar25,node_00);
      puVar24 = &stack0xfffffffffffffec8;
      if (bVar4) {
        local_e0.sequence = &local_130;
        local_118 = this;
        local_e0.this = this;
        local_e0.loc = loc;
        iVar5 = (*node_00->_vptr_TIntermNode[8])(node_00);
        pTVar19 = (TIntermSymbol *)CONCAT44(extraout_var_03,iVar5);
        iVar5 = (*node_00->_vptr_TIntermNode[6])(node_00);
        plVar9 = (long *)CONCAT44(extraout_var_04,iVar5);
        local_108 = loc;
        local_100 = pTVar19;
        if ((pTVar19 == (TIntermSymbol *)0x0) ||
           ((iVar5 = (int)pTVar19->id, iVar5 != 0x36 && (iVar5 != 0x33)))) {
          local_120 = (TIntermSymbol *)((ulong)local_120 & 0xffffffff00000000);
        }
        else {
          iVar5 = (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
          plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x30))
                                     ((long *)CONCAT44(extraout_var_05,iVar5));
          local_120 = (TIntermSymbol *)
                      CONCAT44(local_120._4_4_,(int)CONCAT71((int7)((ulong)plVar9 >> 8),1));
        }
        lVar10 = (**(code **)(*plVar9 + 400))(plVar9);
        pTVar11 = (TIntermTyped *)(**(code **)(*(long *)**(undefined8 **)(lVar10 + 8) + 0x18))();
        lVar10 = (**(code **)(*plVar9 + 400))(plVar9);
        local_f0 = (TIntermSymbol *)(**(code **)(**(long **)(*(long *)(lVar10 + 8) + 8) + 0x18))();
        local_f8 = pTVar11;
        iVar5 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
        sampler = (TSampler *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x40))
                            ((long *)CONCAT44(extraout_var_06,iVar5));
        TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
        getTextureReturnType(local_118,sampler,&local_c8);
        if (pHVar7 != (HlslParseContext *)0x0) {
          iVar5 = (*(pHVar7->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                    [0x33])(pHVar7);
          pTVar11 = (TIntermTyped *)CONCAT44(extraout_var_07,iVar5);
          uVar1 = *(uint *)&(pHVar7->super_TParseContextBase).super_TParseVersions.spvUnsupportedExt
                            .
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
          uVar21 = uVar1 - 0x1df;
          if (uVar21 < 0xf) {
            uVar21 = 0x7ffe >> ((byte)uVar21 & 0x1f);
            local_110 = pTVar11;
            local_e8 = (TIntermSymbol *)(ulong)uVar1;
            iVar5 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar11);
            loc_00 = local_108;
            pTVar19 = (TIntermSymbol *)CONCAT44(extraout_var_08,iVar5);
            if (((char)local_120 != '\0' || pTVar19 == (TIntermSymbol *)0x0) ||
               (pHVar25 = local_118, (uVar21 & 1) != 0)) {
              pTVar19 = makeInternalVariableNode(local_118,local_108,"storeTemp",&local_c8);
              pTVar18 = local_100;
              if (local_100 != (TIntermSymbol *)0x0) {
                local_128 = (TIntermSymbol *)((ulong)local_128 & 0xffffffff00000000);
                iVar5 = (*(local_100->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])
                                  ();
                lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar5) + 0x28))
                                   ((long *)CONCAT44(extraout_var_22,iVar5));
                iVar5 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])
                                  (pTVar18);
                plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar5) + 0x30))
                                           ((long *)CONCAT44(extraout_var_23,iVar5));
                if (lVar10 == 0) {
                  if (plVar9 == (long *)0x0) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                                  ,0x15b,
                                  "auto glslang::HlslParseContext::handleLvalue(const TSourceLoc &, const char *, TIntermTyped *&)::(anonymous class)::operator()(TIntermSymbol *, TIntermBinary *) const"
                                 );
                  }
                  lVar14 = (**(code **)(*plVar9 + 0x198))(plVar9);
                  lVar10 = *(long *)(lVar14 + 8);
                  if (0 < (int)((ulong)(*(long *)(lVar14 + 0x10) - lVar10) >> 3)) {
                    lVar26 = 0;
                    do {
                      lVar10 = (**(code **)(**(long **)(lVar10 + lVar26 * 8) + 0x28))();
                      *(undefined1 *)
                       ((long)&local_128 + (long)**(int **)(*(long *)(lVar10 + 0xc0) + 8)) = 1;
                      lVar26 = lVar26 + 1;
                      lVar10 = *(long *)(lVar14 + 8);
                    } while (lVar26 < (int)((ulong)(*(long *)(lVar14 + 0x10) - lVar10) >> 3));
                  }
                }
                else {
                  *(undefined1 *)((long)&local_128 + (long)**(int **)(*(long *)(lVar10 + 0xc0) + 8))
                       = 1;
                }
                iVar5 = (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar19);
                iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar5) + 0x60))
                                  ((long *)CONCAT44(extraout_var_24,iVar5));
                loc_00 = local_108;
                uVar22 = (ulong)iVar5;
                if (0 < (long)uVar22 >> 2) {
                  puVar24 = &stack0xfffffffffffffec8 + (uVar22 & 0xfffffffffffffffc);
                  lVar10 = ((long)uVar22 >> 2) + 1;
                  pcVar23 = (char *)((long)&local_128 + 3);
                  do {
                    if (pcVar23[-3] != '\x01') {
                      pcVar23 = pcVar23 + -3;
                      goto LAB_0037bc0e;
                    }
                    if (pcVar23[-2] != '\x01') {
                      pcVar23 = pcVar23 + -2;
                      goto LAB_0037bc0e;
                    }
                    if (pcVar23[-1] != '\x01') {
                      pcVar23 = pcVar23 + -1;
                      goto LAB_0037bc0e;
                    }
                    if (*pcVar23 != '\x01') goto LAB_0037bc0e;
                    lVar10 = lVar10 + -1;
                    pcVar23 = pcVar23 + 4;
                  } while (1 < lVar10);
                }
                pcVar23 = puVar24 + 0x10;
                lVar10 = (long)((long)&local_128 + uVar22) - (long)pcVar23;
                if (lVar10 == 1) {
LAB_0037bbf0:
                  if (*pcVar23 == '\x01') goto LAB_0037bc38;
                }
                else if (lVar10 == 2) {
LAB_0037bbe8:
                  if (*pcVar23 == '\x01') {
                    pcVar23 = pcVar23 + 1;
                    goto LAB_0037bbf0;
                  }
                }
                else {
                  if (lVar10 != 3) goto LAB_0037bc38;
                  if (*pcVar23 == '\x01') {
                    pcVar23 = puVar24 + 0x11;
                    goto LAB_0037bbe8;
                  }
                }
LAB_0037bc0e:
                if (pcVar23 != (char *)((long)&local_128 + uVar22)) {
                  (*(local_118->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                    [0x2d])(local_118,local_108,"unimplemented: partial image updates","","");
                }
              }
LAB_0037bc38:
              pTVar18 = local_f0;
              pHVar25 = local_118;
              local_120 = pTVar19;
              if ((uVar21 & 1) != 0) {
                iVar5 = (*(local_f0->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (local_f0);
                pHVar25 = local_118;
                left = makeInternalVariableNode
                                 (local_118,loc_00,"coordTemp",
                                  (TType *)CONCAT44(extraout_var_25,iVar5));
                pTVar12 = local_130;
                pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar5 = (*(left->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (left);
                pTVar15 = TIntermediate::addBinaryNode
                                    (pTVar2,EOpAssign,&left->super_TIntermTyped,
                                     &pTVar18->super_TIntermTyped,local_108,
                                     (TType *)CONCAT44(extraout_var_26,iVar5));
                local_130 = TIntermediate::growAggregate
                                      (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar15,
                                       local_108);
                pTVar16 = GetThreadPoolAllocator();
                pTVar17 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar16,0x188);
                TIntermAggregate::TIntermAggregate(pTVar17,EOpImageLoad);
                (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[1])(pTVar17,local_108);
                iVar5 = (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x32])(pTVar17);
                local_128 = (TIntermSymbol *)local_f8;
                std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
                emplace_back<TIntermNode*>
                          ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                           CONCAT44(extraout_var_27,iVar5),(TIntermNode **)&local_128);
                iVar5 = (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x32])(pTVar17);
                pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar6 = (*(left->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(left)
                ;
                pTVar19 = local_120;
                local_128 = TIntermediate::addSymbol
                                      (pTVar2,(TIntermSymbol *)CONCAT44(extraout_var_29,iVar6));
                std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
                emplace_back<TIntermNode*>
                          ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                           CONCAT44(extraout_var_28,iVar5),(TIntermNode **)&local_128);
                (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1d])(pTVar17,&local_c8);
                loc_00 = local_108;
                pTVar12 = local_130;
                pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
                pTVar11 = TIntermediate::addAssign
                                    (pTVar2,EOpAssign,&pTVar19->super_TIntermTyped,
                                     (TIntermTyped *)pTVar17,local_108);
                local_130 = TIntermediate::growAggregate
                                      (pTVar2,(TIntermNode *)pTVar12,&pTVar11->super_TIntermNode,
                                       loc_00);
                local_f0 = left;
              }
              pTVar18 = TIntermediate::addSymbol
                                  ((pHVar25->super_TParseContextBase).super_TParseVersions.
                                   intermediate,pTVar19);
              pTVar19 = local_100;
              if (local_100 != (TIntermSymbol *)0x0) {
                pTVar2 = (local_118->super_TParseContextBase).super_TParseVersions.intermediate;
                lVar3 = local_100->id;
                iVar5 = (*(local_100->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])
                                  (local_100);
                iVar6 = (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar19);
                pHVar25 = local_118;
                pTVar18 = (TIntermSymbol *)
                          TIntermediate::addBinaryNode
                                    (pTVar2,(TOperator)lVar3,&pTVar18->super_TIntermTyped,
                                     (TIntermTyped *)CONCAT44(extraout_var_30,iVar5),loc_00,
                                     (TType *)CONCAT44(extraout_var_31,iVar6));
              }
              pTVar12 = local_130;
              pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
              iVar5 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (pTVar18);
              pTVar15 = TIntermediate::addBinaryNode
                                  (pTVar2,(TOperator)local_e8,&pTVar18->super_TIntermTyped,local_110
                                   ,loc_00,(TType *)CONCAT44(extraout_var_32,iVar5));
              local_130 = TIntermediate::growAggregate
                                    (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar15,loc_00);
              pTVar19 = local_120;
            }
            handleLvalue::anon_class_24_3_d1780b14::operator()
                      (&local_e0,local_f8,&local_f0->super_TIntermTyped,pTVar19);
            pTVar12 = local_130;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar19 = TIntermediate::addSymbol(pTVar2,pTVar19);
            local_130 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar19);
            (*(local_130->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x31])(local_130,1);
            pp_Var20 = (local_130->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode;
            goto LAB_0037bec1;
          }
        }
        loc_00 = local_108;
        pHVar25 = local_118;
        this = local_118;
        loc = local_108;
        if (pHVar8 != (HlslParseContext *)0x0) {
          uVar1 = *(uint *)&(pHVar8->super_TParseContextBase).super_TParseVersions.spvUnsupportedExt
                            .
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
          if (uVar1 - 0xc < 2) {
            local_110 = (TIntermTyped *)(ulong)uVar1;
            local_100 = makeInternalVariableNode(local_118,local_108,"storeTempPre",&local_c8);
            local_120 = makeInternalVariableNode(pHVar25,loc_00,"storeTempPost",&local_c8);
            pTVar19 = local_f0;
            iVar5 = (*(local_f0->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (local_f0);
            pTVar18 = makeInternalVariableNode
                                (pHVar25,loc_00,"coordTemp",(TType *)CONCAT44(extraout_var_15,iVar5)
                                );
            pTVar12 = local_130;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar18);
            pTVar15 = TIntermediate::addBinaryNode
                                (pTVar2,EOpAssign,&pTVar18->super_TIntermTyped,
                                 &pTVar19->super_TIntermTyped,loc_00,
                                 (TType *)CONCAT44(extraout_var_16,iVar5));
            local_130 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar15,loc_00);
            pTVar16 = GetThreadPoolAllocator();
            pTVar17 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar16,0x188);
            TIntermAggregate::TIntermAggregate(pTVar17,EOpImageLoad);
            (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[1])(pTVar17,loc_00);
            iVar5 = (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(pTVar17);
            local_128 = (TIntermSymbol *)local_f8;
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var_17,iVar5),(TIntermNode **)&local_128);
            iVar5 = (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(pTVar17);
            pHVar25 = local_118;
            pTVar2 = (local_118->super_TParseContextBase).super_TParseVersions.intermediate;
            local_e8 = pTVar18;
            iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])
                              (pTVar18);
            local_128 = TIntermediate::addSymbol
                                  (pTVar2,(TIntermSymbol *)CONCAT44(extraout_var_19,iVar6));
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var_18,iVar5),(TIntermNode **)&local_128);
            (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1d])(pTVar17,&local_c8);
            pTVar18 = local_100;
            pTVar12 = local_130;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar11 = TIntermediate::addAssign
                                (pTVar2,EOpAssign,&local_100->super_TIntermTyped,
                                 (TIntermTyped *)pTVar17,loc_00);
            pTVar12 = TIntermediate::growAggregate
                                (pTVar2,(TIntermNode *)pTVar12,&pTVar11->super_TIntermNode,loc_00);
            pTVar19 = local_120;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            local_130 = pTVar12;
            iVar5 = (*(local_120->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (local_120);
            pTVar15 = TIntermediate::addBinaryNode
                                (pTVar2,EOpAssign,&pTVar19->super_TIntermTyped,
                                 &pTVar18->super_TIntermTyped,loc_00,
                                 (TType *)CONCAT44(extraout_var_20,iVar5));
            pTVar12 = TIntermediate::growAggregate
                                (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar15,loc_00);
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            local_130 = pTVar12;
            pTVar18 = TIntermediate::addSymbol(pTVar2,pTVar19);
            iVar5 = (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar19);
            pTVar13 = TIntermediate::addUnaryNode
                                (pTVar2,(TOperator)local_110,&pTVar18->super_TIntermTyped,loc_00,
                                 (TType *)CONCAT44(extraout_var_21,iVar5));
            local_130 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar13,loc_00);
            handleLvalue::anon_class_24_3_d1780b14::operator()
                      (&local_e0,local_f8,&local_e8->super_TIntermTyped,pTVar19);
            pTVar12 = local_130;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar19 = TIntermediate::addSymbol(pTVar2,local_100);
            local_130 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar19);
            (*(local_130->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x31])(local_130,1);
            pp_Var20 = (local_130->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode;
LAB_0037bec1:
            (*pp_Var20[1])(local_130,loc_00);
            (*(local_130->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1d])(local_130,&local_c8);
            return (TIntermTyped *)local_130;
          }
          if (uVar1 - 0xe < 2) {
            local_110 = (TIntermTyped *)(ulong)uVar1;
            local_100 = makeInternalVariableNode(local_118,local_108,"storeTemp",&local_c8);
            pTVar19 = local_f0;
            iVar5 = (*(local_f0->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (local_f0);
            pTVar18 = makeInternalVariableNode
                                (pHVar25,loc_00,"coordTemp",(TType *)CONCAT44(extraout_var_09,iVar5)
                                );
            pTVar12 = local_130;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar18);
            pTVar15 = TIntermediate::addBinaryNode
                                (pTVar2,EOpAssign,&pTVar18->super_TIntermTyped,
                                 &pTVar19->super_TIntermTyped,loc_00,
                                 (TType *)CONCAT44(extraout_var_10,iVar5));
            local_130 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar15,loc_00);
            pTVar16 = GetThreadPoolAllocator();
            pTVar17 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar16,0x188);
            TIntermAggregate::TIntermAggregate(pTVar17,EOpImageLoad);
            (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[1])(pTVar17,loc_00);
            iVar5 = (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(pTVar17);
            local_128 = (TIntermSymbol *)local_f8;
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var_11,iVar5),(TIntermNode **)&local_128);
            iVar5 = (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(pTVar17);
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            local_120 = pTVar18;
            iVar6 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])
                              (pTVar18);
            local_128 = TIntermediate::addSymbol
                                  (pTVar2,(TIntermSymbol *)CONCAT44(extraout_var_13,iVar6));
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var_12,iVar5),(TIntermNode **)&local_128);
            (*(pTVar17->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1d])(pTVar17,&local_c8);
            pTVar19 = local_100;
            pTVar12 = local_130;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar11 = TIntermediate::addAssign
                                (pTVar2,EOpAssign,&local_100->super_TIntermTyped,
                                 (TIntermTyped *)pTVar17,loc_00);
            pTVar12 = TIntermediate::growAggregate
                                (pTVar2,(TIntermNode *)pTVar12,&pTVar11->super_TIntermNode,loc_00);
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            local_130 = pTVar12;
            pTVar18 = TIntermediate::addSymbol(pTVar2,pTVar19);
            iVar5 = (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar19);
            pTVar13 = TIntermediate::addUnaryNode
                                (pTVar2,(TOperator)local_110,&pTVar18->super_TIntermTyped,loc_00,
                                 (TType *)CONCAT44(extraout_var_14,iVar5));
            local_130 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar13,loc_00);
            handleLvalue::anon_class_24_3_d1780b14::operator()
                      (&local_e0,local_f8,&local_120->super_TIntermTyped,pTVar19);
            pTVar12 = local_130;
            pTVar2 = (pHVar25->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar19 = TIntermediate::addSymbol(pTVar2,pTVar19);
            local_130 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)pTVar12,(TIntermNode *)pTVar19);
            (*(local_130->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x31])(local_130,1);
            pp_Var20 = (local_130->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode;
            goto LAB_0037bec1;
          }
        }
      }
      else if (node_00 == (TIntermNode *)0x0) goto LAB_0037b7e0;
      iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                        (this,loc,local_110,node_00);
      if ((char)iVar5 != '\0') goto LAB_0037b7d2;
    }
LAB_0037b7e0:
    pTVar11 = *node;
  }
  return pTVar11;
}

Assistant:

TIntermTyped* HlslParseContext::handleLvalue(const TSourceLoc& loc, const char* op, TIntermTyped*& node)
{
    if (node == nullptr)
        return nullptr;

    TIntermBinary* nodeAsBinary = node->getAsBinaryNode();
    TIntermUnary* nodeAsUnary = node->getAsUnaryNode();
    TIntermAggregate* sequence = nullptr;

    TIntermTyped* lhs = nodeAsUnary  ? nodeAsUnary->getOperand() :
                        nodeAsBinary ? nodeAsBinary->getLeft() :
                        nullptr;

    // Early bail out if there is no conversion to apply
    if (!shouldConvertLValue(lhs)) {
        if (lhs != nullptr)
            if (lValueErrorCheck(loc, op, lhs))
                return nullptr;
        return node;
    }

    // *** If we get here, we're going to apply some conversion to an l-value.

    // Helper to create a load.
    const auto makeLoad = [&](TIntermSymbol* rhsTmp, TIntermTyped* object, TIntermTyped* coord, const TType& derefType) {
        TIntermAggregate* loadOp = new TIntermAggregate(EOpImageLoad);
        loadOp->setLoc(loc);
        loadOp->getSequence().push_back(object);
        loadOp->getSequence().push_back(intermediate.addSymbol(*coord->getAsSymbolNode()));
        loadOp->setType(derefType);

        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addAssign(EOpAssign, rhsTmp, loadOp, loc),
                                              loc);
    };

    // Helper to create a store.
    const auto makeStore = [&](TIntermTyped* object, TIntermTyped* coord, TIntermSymbol* rhsTmp) {
        TIntermAggregate* storeOp = new TIntermAggregate(EOpImageStore);
        storeOp->getSequence().push_back(object);
        storeOp->getSequence().push_back(coord);
        storeOp->getSequence().push_back(intermediate.addSymbol(*rhsTmp));
        storeOp->setLoc(loc);
        storeOp->setType(TType(EbtVoid));

        sequence = intermediate.growAggregate(sequence, storeOp);
    };

    // Helper to create an assign.
    const auto makeBinary = [&](TOperator op, TIntermTyped* lhs, TIntermTyped* rhs) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addBinaryNode(op, lhs, rhs, loc, lhs->getType()),
                                              loc);
    };

    // Helper to complete sequence by adding trailing variable, so we evaluate to the right value.
    const auto finishSequence = [&](TIntermSymbol* rhsTmp, const TType& derefType) -> TIntermAggregate* {
        // Add a trailing use of the temp, so the sequence returns the proper value.
        sequence = intermediate.growAggregate(sequence, intermediate.addSymbol(*rhsTmp));
        sequence->setOperator(EOpSequence);
        sequence->setLoc(loc);
        sequence->setType(derefType);

        return sequence;
    };

    // Helper to add unary op
    const auto makeUnary = [&](TOperator op, TIntermSymbol* rhsTmp) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addUnaryNode(op, intermediate.addSymbol(*rhsTmp), loc,
                                                                        rhsTmp->getType()),
                                              loc);
    };

    // Return true if swizzle or index writes all components of the given variable.
    const auto writesAllComponents = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> bool {
        if (swizzle == nullptr)  // not a swizzle or index
            return true;

        // Track which components are being set.
        std::array<bool, 4> compIsSet;
        compIsSet.fill(false);

        const TIntermConstantUnion* asConst     = swizzle->getRight()->getAsConstantUnion();
        const TIntermAggregate*     asAggregate = swizzle->getRight()->getAsAggregate();

        // This could be either a direct index, or a swizzle.
        if (asConst) {
            compIsSet[asConst->getConstArray()[0].getIConst()] = true;
        } else if (asAggregate) {
            const TIntermSequence& seq = asAggregate->getSequence();
            for (int comp=0; comp<int(seq.size()); ++comp)
                compIsSet[seq[comp]->getAsConstantUnion()->getConstArray()[0].getIConst()] = true;
        } else {
            assert(0);
        }

        // Return true if all components are being set by the index or swizzle
        return std::all_of(compIsSet.begin(), compIsSet.begin() + var->getType().getVectorSize(),
                           [](bool isSet) { return isSet; } );
    };

    // Create swizzle matching input swizzle
    const auto addSwizzle = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> TIntermTyped* {
        if (swizzle)
            return intermediate.addBinaryNode(swizzle->getOp(), var, swizzle->getRight(), loc, swizzle->getType());
        else
            return var;
    };

    TIntermBinary*    lhsAsBinary    = lhs->getAsBinaryNode();
    TIntermAggregate* lhsAsAggregate = lhs->getAsAggregate();
    bool lhsIsSwizzle = false;

    // If it's a swizzled L-value, remember the swizzle, and use the LHS.
    if (lhsAsBinary != nullptr && (lhsAsBinary->getOp() == EOpVectorSwizzle || lhsAsBinary->getOp() == EOpIndexDirect)) {
        lhsAsAggregate = lhsAsBinary->getLeft()->getAsAggregate();
        lhsIsSwizzle = true;
    }

    TIntermTyped* object = lhsAsAggregate->getSequence()[0]->getAsTyped();
    TIntermTyped* coord  = lhsAsAggregate->getSequence()[1]->getAsTyped();

    const TSampler& texSampler = object->getType().getSampler();

    TType objDerefType;
    getTextureReturnType(texSampler, objDerefType);

    if (nodeAsBinary) {
        TIntermTyped* rhs = nodeAsBinary->getRight();
        const TOperator assignOp = nodeAsBinary->getOp();

        bool isModifyOp = false;

        switch (assignOp) {
        case EOpAddAssign:
        case EOpSubAssign:
        case EOpMulAssign:
        case EOpVectorTimesMatrixAssign:
        case EOpVectorTimesScalarAssign:
        case EOpMatrixTimesScalarAssign:
        case EOpMatrixTimesMatrixAssign:
        case EOpDivAssign:
        case EOpModAssign:
        case EOpAndAssign:
        case EOpInclusiveOrAssign:
        case EOpExclusiveOrAssign:
        case EOpLeftShiftAssign:
        case EOpRightShiftAssign:
            isModifyOp = true;
            [[fallthrough]];
        case EOpAssign:
            {
                // Since this is an lvalue, we'll convert an image load to a sequence like this
                // (to still provide the value):
                //   OpSequence
                //      OpImageStore(object, lhs, rhs)
                //      rhs
                // But if it's not a simple symbol RHS (say, a fn call), we don't want to duplicate the RHS,
                // so we'll convert instead to this:
                //   OpSequence
                //      rhsTmp = rhs
                //      OpImageStore(object, coord, rhsTmp)
                //      rhsTmp
                // If this is a read-modify-write op, like +=, we issue:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op= rhs
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp
                //
                // If the lvalue is swizzled, we apply that when writing the temp variable, like so:
                //    ...
                //    rhsTmp.some_swizzle = ...
                // For partial writes, an error is generated.

                TIntermSymbol* rhsTmp = rhs->getAsSymbolNode();
                TIntermTyped* coordTmp = coord;

                if (rhsTmp == nullptr || isModifyOp || lhsIsSwizzle) {
                    rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);

                    // Partial updates not yet supported
                    if (!writesAllComponents(rhsTmp, lhsAsBinary)) {
                        error(loc, "unimplemented: partial image updates", "", "");
                    }

                    // Assign storeTemp = rhs
                    if (isModifyOp) {
                        // We have to make a temp var for the coordinate, to avoid evaluating it twice.
                        coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());
                        makeBinary(EOpAssign, coordTmp, coord); // coordtmp = load[param1]
                        makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                    }

                    // rhsTmp op= rhs.
                    makeBinary(assignOp, addSwizzle(intermediate.addSymbol(*rhsTmp), lhsAsBinary), rhs);
                }

                makeStore(object, coordTmp, rhsTmp);         // add a store
                return finishSequence(rhsTmp, objDerefType); // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (nodeAsUnary) {
        const TOperator assignOp = nodeAsUnary->getOp();

        switch (assignOp) {
        case EOpPreIncrement:
        case EOpPreDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp

                TIntermSymbol* rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);           // coordtmp = load[param1]
                makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                makeUnary(assignOp, rhsTmp);                      // op rhsTmp
                makeStore(object, coordTmp, rhsTmp);              // OpImageStore(object, coordTmp, rhsTmp)
                return finishSequence(rhsTmp, objDerefType);      // return rhsTmp from sequence
            }

        case EOpPostIncrement:
        case EOpPostDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp1 = OpImageLoad(object, coordTmp)
                //      rhsTmp2 = rhsTmp1
                //      rhsTmp2 op
                //      OpImageStore(object, coordTmp, rhsTmp2)
                //      rhsTmp1 (pre-op value)
                TIntermSymbol* rhsTmp1 = makeInternalVariableNode(loc, "storeTempPre",  objDerefType);
                TIntermSymbol* rhsTmp2 = makeInternalVariableNode(loc, "storeTempPost", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);            // coordtmp = load[param1]
                makeLoad(rhsTmp1, object, coordTmp, objDerefType); // rhsTmp1 = OpImageLoad(object, coordTmp)
                makeBinary(EOpAssign, rhsTmp2, rhsTmp1);           // rhsTmp2 = rhsTmp1
                makeUnary(assignOp, rhsTmp2);                      // rhsTmp op
                makeStore(object, coordTmp, rhsTmp2);              // OpImageStore(object, coordTmp, rhsTmp2)
                return finishSequence(rhsTmp1, objDerefType);      // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (lhs)
        if (lValueErrorCheck(loc, op, lhs))
            return nullptr;

    return node;
}